

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::changeBoss(Company *this)

{
  long lVar1;
  int iVar2;
  Boss *this_00;
  long lVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = Employee::efficiency(&this->boss->super_Employee);
  if (dVar4 < 40.0) {
    this_00 = (Boss *)maxEfficiency(this);
    lVar1 = 0;
    while( true ) {
      lVar3 = lVar1;
      iVar2 = Boss::getNumberOfEmployees(this->boss);
      if (iVar2 <= lVar3) break;
      dVar4 = Employee::efficiency(this->employees[lVar3]);
      dVar5 = Employee::efficiency((Employee *)this_00);
      lVar1 = lVar3 + 1;
      if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
        iVar2 = Boss::getNumberOfEmployees(this->boss);
        this->employees[lVar3] = &this->boss->super_Employee;
        this->boss = this_00;
        Boss::setNumberOfEmployees(this_00,iVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void Company::changeBoss() {
    if (boss->efficiency() < 40) {
        Employee *maxEmp = maxEfficiency();
        for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
            if (employees[i]->efficiency() ==  maxEmp->efficiency()) {
                int number = boss->getNumberOfEmployees();
                employees[i] = boss;
                boss = static_cast<Boss *>(maxEmp);
                boss->setNumberOfEmployees(number);
                break;
            }
        }
    }
}